

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O2

void __thiscall RigidBodyDynamics::FixedBody::FixedBody(FixedBody *this,FixedBody *param_1)

{
  double dVar1;
  long lVar2;
  long lVar3;
  Matrix3d *pMVar4;
  SpatialTransform *pSVar5;
  Matrix3d *pMVar6;
  SpatialTransform *pSVar7;
  
  this->mMass = param_1->mMass;
  dVar1 = (param_1->mCenterOfMass).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  (this->mCenterOfMass).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] =
       (param_1->mCenterOfMass).super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  (this->mCenterOfMass).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = dVar1;
  (this->mCenterOfMass).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] =
       (param_1->mCenterOfMass).super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  lVar3 = 9;
  pMVar4 = &param_1->mInertia;
  pMVar6 = &this->mInertia;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pMVar6->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[0] =
         (pMVar4->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
    pMVar4 = (Matrix3d *)
             ((pMVar4->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array + 1);
    pMVar6 = (Matrix3d *)
             ((pMVar6->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array + 1);
  }
  this->mMovableParent = param_1->mMovableParent;
  pSVar5 = &param_1->mParentTransform;
  pSVar7 = &this->mParentTransform;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pSVar7->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] =
         (pSVar5->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
    pSVar5 = (SpatialTransform *)
             ((pSVar5->E).super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             1);
    pSVar7 = (SpatialTransform *)
             ((pSVar7->E).super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             1);
  }
  *(double *)
   ((long)(this->mParentTransform).r.super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 0x10
   ) = *(double *)
        ((long)(param_1->mParentTransform).r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
        0x10);
  dVar1 = *(double *)
           ((long)(param_1->mParentTransform).r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 8);
  (this->mParentTransform).r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (param_1->mParentTransform).r.super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  *(double *)
   ((long)(this->mParentTransform).r.super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 8) =
       dVar1;
  pSVar5 = &param_1->mBaseTransform;
  pSVar7 = &this->mBaseTransform;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pSVar7->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] =
         (pSVar5->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
    pSVar5 = (SpatialTransform *)
             ((pSVar5->E).super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             1);
    pSVar7 = (SpatialTransform *)
             ((pSVar7->E).super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             1);
  }
  *(double *)
   ((long)(this->mBaseTransform).r.super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 0x10
   ) = *(double *)
        ((long)(param_1->mBaseTransform).r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
        0x10);
  dVar1 = *(double *)
           ((long)(param_1->mBaseTransform).r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array + 8);
  (this->mBaseTransform).r.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (param_1->mBaseTransform).r.super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  *(double *)
   ((long)(this->mBaseTransform).r.super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 8) =
       dVar1;
  return;
}

Assistant:

struct RBDL_DLLAPI FixedBody {
	/// \brief The mass of the body
	double mMass;
	/// \brief The position of the center of mass in body coordinates
	Math::Vector3d mCenterOfMass;
	/// \brief The spatial inertia that contains both mass and inertia information
	Math::Matrix3d mInertia;

	/// \brief Id of the movable body that this fixed body is attached to.
	unsigned int mMovableParent;
	/// \brief Transforms spatial quantities expressed for the parent to the
	// fixed body. 
	Math::SpatialTransform mParentTransform;
	Math::SpatialTransform mBaseTransform;

	static FixedBody CreateFromBody (const Body& body) {
		FixedBody fbody;

		fbody.mMass = body.mMass;
		fbody.mCenterOfMass = body.mCenterOfMass;
		fbody.mInertia = body.mInertia;

		return fbody;
	}
}